

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderConstXmlLang(xmlTextReaderPtr reader)

{
  xmlChar *string;
  xmlChar *pxVar1;
  
  if (((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNode *)0x0)) &&
     (string = xmlNodeGetLang(reader->node), string != (xmlChar *)0x0)) {
    pxVar1 = constString(reader,string);
    (*xmlFree)(string);
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlTextReaderConstXmlLang(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    tmp = xmlNodeGetLang(reader->node);
    if (tmp == NULL)
        return(NULL);
    ret = constString(reader, tmp);
    xmlFree(tmp);
    return(ret);
}